

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

size_t release_unused_segments(mstate m)

{
  void *ptr;
  size_t size_00;
  malloc_segment *pmVar1;
  malloc_tree_chunk *pmVar2;
  int iVar3;
  uint uVar4;
  tbinptr pmVar5;
  ulong uVar6;
  malloc_tree_chunk *pmVar7;
  size_t *psVar8;
  bool bVar9;
  msegmentptr local_108;
  byte local_100;
  ulong local_e8;
  tchunkptr F_1;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I;
  tbinptr *H_1;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr tp;
  size_t psize;
  mchunkptr p;
  msegmentptr next;
  size_t size;
  char *base;
  msegmentptr sp;
  msegmentptr pred;
  size_t nsegs;
  size_t released;
  mstate m_local;
  
  nsegs = 0;
  pred = (msegmentptr)0x0;
  sp = &m->seg;
  base = (char *)(m->seg).next;
  do {
    if (base == (char *)0x0) {
      if (pred < (msegmentptr)0x100) {
        local_108 = (msegmentptr)0xff;
      }
      else {
        local_108 = pred;
      }
      m->release_checks = (size_t)local_108;
      return nsegs;
    }
    ptr = *(void **)base;
    size_00 = *(size_t *)(base + 8);
    pmVar1 = *(malloc_segment **)(base + 0x10);
    pred = (msegmentptr)((long)&pred->base + 1);
    if (((long)ptr + 0x10U & 7) == 0) {
      local_e8 = 0;
    }
    else {
      local_e8 = 8 - ((long)ptr + 0x10U & 7) & 7;
    }
    pmVar5 = (tbinptr)((long)ptr + local_e8);
    uVar6 = pmVar5->head & 0xfffffffffffffffc;
    if (((pmVar5->head & 2) == 0) &&
       ((long)ptr + (size_00 - 0x40) <= (long)pmVar5->child + (uVar6 - 0x20))) {
      if (pmVar5 == (tbinptr)m->dv) {
        m->dv = (mchunkptr)0x0;
        m->dvsize = 0;
      }
      else {
        pmVar7 = pmVar5->parent;
        if (pmVar5->bk == pmVar5) {
          CP = pmVar5->child + 1;
          F = pmVar5->child[1];
          if (F == (malloc_tree_chunk *)0x0) {
            CP = pmVar5->child;
            F = pmVar5->child[0];
            if (F == (malloc_tree_chunk *)0x0) goto LAB_0013441d;
          }
          while( true ) {
            H = F->child + 1;
            bVar9 = true;
            if (F->child[1] == (malloc_tree_chunk *)0x0) {
              H = F->child;
              bVar9 = F->child[0] != (malloc_tree_chunk *)0x0;
            }
            if (!bVar9) break;
            CP = H;
            F = *H;
          }
          *CP = (tchunkptr)0x0;
        }
        else {
          pmVar2 = pmVar5->fd;
          F = pmVar5->bk;
          pmVar2->bk = F;
          F->fd = pmVar2;
        }
LAB_0013441d:
        if (pmVar7 != (malloc_tree_chunk *)0x0) {
          if (pmVar5 == m->treebins[pmVar5->index]) {
            m->treebins[pmVar5->index] = F;
            if (F == (tchunkptr)0x0) {
              m->treemap = (1 << ((byte)pmVar5->index & 0x1f) ^ 0xffffffffU) & m->treemap;
            }
          }
          else if (pmVar7->child[0] == pmVar5) {
            pmVar7->child[0] = F;
          }
          else {
            pmVar7->child[1] = F;
          }
          if (F != (tchunkptr)0x0) {
            F->parent = pmVar7;
            pmVar7 = pmVar5->child[0];
            if (pmVar7 != (malloc_tree_chunk *)0x0) {
              F->child[0] = pmVar7;
              pmVar7->parent = F;
            }
            pmVar7 = pmVar5->child[1];
            if (pmVar7 != (malloc_tree_chunk *)0x0) {
              F->child[1] = pmVar7;
              pmVar7->parent = F;
            }
          }
        }
      }
      iVar3 = CALL_MUNMAP(ptr,size_00);
      if (iVar3 == 0) {
        nsegs = size_00 + nsegs;
        base = (char *)sp;
        sp->next = pmVar1;
      }
      else {
        uVar4 = (uint)(uVar6 >> 8);
        if (uVar4 == 0) {
          _K = 0;
        }
        else if (uVar4 < 0x10000) {
          iVar3 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          _K = (ulong)(uint)(iVar3 << 1) + (uVar6 >> ((char)iVar3 + 7U & 0x3f) & 1);
        }
        else {
          _K = 0x1f;
        }
        pmVar7 = (malloc_tree_chunk *)(m->treebins + _K);
        pmVar5->index = _K;
        pmVar5->child[1] = (malloc_tree_chunk *)0x0;
        pmVar5->child[0] = (malloc_tree_chunk *)0x0;
        if ((m->treemap & 1 << ((byte)_K & 0x1f)) == 0) {
          m->treemap = 1 << ((byte)_K & 0x1f) | m->treemap;
          pmVar7->prev_foot = (size_t)pmVar5;
          pmVar5->parent = pmVar7;
          pmVar5->bk = pmVar5;
          pmVar5->fd = pmVar5;
        }
        else {
          K_1 = pmVar7->prev_foot;
          if (_K == 0x1f) {
            local_100 = 0;
          }
          else {
            local_100 = 0x3f - ((char)(_K >> 1) + '\x06');
          }
          C = (tchunkptr *)(uVar6 << (local_100 & 0x3f));
          while ((*(ulong *)(K_1 + 8) & 0xfffffffffffffffc) != uVar6) {
            psVar8 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
            C = (tchunkptr *)((long)C << 1);
            if (*psVar8 == 0) {
              *psVar8 = (size_t)pmVar5;
              pmVar5->parent = (malloc_tree_chunk *)K_1;
              pmVar5->bk = pmVar5;
              pmVar5->fd = pmVar5;
              goto LAB_00134819;
            }
            K_1 = *psVar8;
          }
          pmVar7 = *(malloc_tree_chunk **)(K_1 + 0x10);
          pmVar7->bk = pmVar5;
          *(tbinptr *)(K_1 + 0x10) = pmVar5;
          pmVar5->fd = pmVar7;
          pmVar5->bk = (malloc_tree_chunk *)K_1;
          pmVar5->parent = (malloc_tree_chunk *)0x0;
        }
      }
    }
LAB_00134819:
    sp = (msegmentptr)base;
    base = (char *)pmVar1;
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m)
{
  size_t released = 0;
  size_t nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char *base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    nsegs++;
    {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!cinuse(p) && (char *)p + psize >= base + size - TOP_FOOT_SIZE) {
	tchunkptr tp = (tchunkptr)p;
	if (p == m->dv) {
	  m->dv = 0;
	  m->dvsize = 0;
	} else {
	  unlink_large_chunk(m, tp);
	}
	if (CALL_MUNMAP(base, size) == 0) {
	  released += size;
	  /* unlink obsoleted record */
	  sp = pred;
	  sp->next = next;
	} else { /* back out if cannot unmap */
	  insert_large_chunk(m, tp, psize);
	}
      }
    }
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = nsegs > MAX_RELEASE_CHECK_RATE ?
		      nsegs : MAX_RELEASE_CHECK_RATE;
  return released;
}